

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O2

void __thiscall Layout::addItem(Layout *this,LayoutItem *item)

{
  LayoutItem *this_00;
  LayoutItem *item_local;
  LayoutItem *flex;
  
  item_local = item;
  if ((this->m_insertFlexSpacer == true) && (item->m_ltype == TYPE_CELL)) {
    this_00 = (LayoutItem *)operator_new(0x90);
    LayoutItem::LayoutItem(this_00,TYPE_FLEXSPACE);
    this_00->m_size = -1.0;
    (&this_00->m_x)[this->m_dir == DIR_HORIZONTAL] = this->m_edgePos;
    flex = this_00;
    std::__cxx11::list<LayoutItem_*,_std::allocator<LayoutItem_*>_>::push_back(&this->m_items,&flex)
    ;
  }
  std::__cxx11::list<LayoutItem_*,_std::allocator<LayoutItem_*>_>::push_back
            (&this->m_items,&item_local);
  this->m_insertFlexSpacer = item_local->m_ltype == TYPE_CELL;
  return;
}

Assistant:

void addItem(LayoutItem *item)
    {
        if ((m_insertFlexSpacer) &&
             (item->m_ltype == LayoutItem::TYPE_CELL))
        {
            LayoutItem *flex = new LayoutItem(LayoutItem::TYPE_FLEXSPACE);
            flex->m_size = -1;
            setItemEdgePos(flex);
            m_items.push_back(flex);
        }

        m_items.push_back(item);
        
        if (item->m_ltype == LayoutItem::TYPE_CELL)
        {
            // auto-insert a flex space the next time
            // a regular CELL is inserted.
            //
            // this way, there will always be a flex
            // space between regular cells unless
            // we insert a fixed spacer or offset.
            m_insertFlexSpacer = true;
        }
        else
        {
            m_insertFlexSpacer = false;
        }
    }